

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O0

void G_DoCompleted(void)

{
  FTextureID FVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  level_info_t *plVar5;
  cluster_info_t *cluster;
  cluster_info_t *pcVar6;
  long lVar7;
  long lVar8;
  EFinishLevelType local_34;
  EFinishLevelType mode;
  cluster_info_t *nextcluster;
  cluster_info_t *thiscluster;
  level_info_t *nextinfo;
  int i;
  
  gameaction = ga_nothing;
  if (gamestate == GS_DEMOSCREEN) {
    gameaction = ga_nothing;
    return;
  }
  if (gamestate == GS_FULLCONSOLE) {
    gameaction = ga_nothing;
    return;
  }
  if (gamestate == GS_STARTUP) {
    gameaction = ga_nothing;
    return;
  }
  if (gamestate == GS_TITLELEVEL) {
    FString::operator=(&level.MapName,&nextlevel);
    G_DoLoadLevel(startpos,false);
    viewactive = true;
    startpos = 0;
    return;
  }
  if ((level.flags & 0x40000000) == 0) {
    pcVar4 = FString::operator_cast_to_char_(&level.MapName);
    plVar5 = FindLevelInfo(pcVar4,true);
    plVar5->flags = plVar5->flags | 0x80000000;
  }
  if ((automapactive & 1U) != 0) {
    AM_Stop();
  }
  wminfo.finished_ep = level.cluster + -1;
  pcVar4 = FString::operator_cast_to_char_(&(level.info)->PName);
  FVar1 = FTextureManager::CheckForTexture(&TexMan,pcVar4,8,1);
  wminfo.LName0 = FTextureManager::operator[](&TexMan,FVar1);
  FString::operator=(&wminfo.current,&level.MapName);
  iVar2 = FIntCVar::operator_cast_to_int(&deathmatch);
  if (((iVar2 == 0) || (uVar3 = FIntCVar::operator_cast_to_int(&dmflags), (uVar3 & 0x40) == 0)) ||
     ((level.flags & 0x40000000) != 0)) {
    pcVar4 = FString::operator_cast_to_char_(&nextlevel);
    plVar5 = FindLevelInfo(pcVar4,false);
    if (plVar5 != (level_info_t *)0x0) {
      pcVar4 = FString::operator_cast_to_char_(&nextlevel);
      iVar2 = strncmp(pcVar4,"enDSeQ",6);
      if (iVar2 != 0) {
        FString::operator=(&wminfo.next,&plVar5->MapName);
        pcVar4 = FString::operator_cast_to_char_(&plVar5->PName);
        FVar1 = FTextureManager::CheckForTexture(&TexMan,pcVar4,8,1);
        wminfo.LName1 = FTextureManager::operator[](&TexMan,FVar1);
        goto LAB_004a6bd0;
      }
    }
    FString::operator=(&wminfo.next,&nextlevel);
    wminfo.LName1 = (FTexture *)0x0;
  }
  else {
    FString::operator=(&wminfo.next,&level.MapName);
    wminfo.LName1 = wminfo.LName0;
  }
LAB_004a6bd0:
  CheckWarpTransMap(&wminfo.next,true);
  FString::operator=(&nextlevel,&wminfo.next);
  pcVar4 = FString::operator_cast_to_char_(&wminfo.next);
  plVar5 = FindLevelInfo(pcVar4,true);
  wminfo.next_ep = plVar5->cluster + -1;
  wminfo.maxkills = level.total_monsters;
  wminfo.maxitems = level.total_items;
  wminfo.maxsecret = level.total_secrets;
  wminfo.maxfrags = 0;
  wminfo.partime = level.partime * 0x23;
  wminfo.sucktime = level.sucktime;
  wminfo.pnum = consoleplayer;
  wminfo.totaltime = level.totaltime;
  for (nextinfo._4_4_ = 0; nextinfo._4_4_ < 8; nextinfo._4_4_ = nextinfo._4_4_ + 1) {
    wminfo.plyr[nextinfo._4_4_].in = (bool)(playeringame[nextinfo._4_4_] & 1);
    wminfo.plyr[nextinfo._4_4_].skills = (&DAT_01ae71b8)[(long)nextinfo._4_4_ * 0xa8];
    wminfo.plyr[nextinfo._4_4_].sitems = *(int *)(&DAT_01ae71bc + (long)nextinfo._4_4_ * 0x2a0);
    wminfo.plyr[nextinfo._4_4_].ssecret = *(int *)(&DAT_01ae71c0 + (long)nextinfo._4_4_ * 0x2a0);
    wminfo.plyr[nextinfo._4_4_].stime = level.time;
    lVar7 = (long)nextinfo._4_4_;
    lVar8 = (long)nextinfo._4_4_ * 0x2a0;
    *(undefined8 *)wminfo.plyr[lVar7].frags = *(undefined8 *)(&DAT_01ae7164 + lVar8);
    *(undefined8 *)(wminfo.plyr[lVar7].frags + 2) = *(undefined8 *)(&DAT_01ae716c + lVar8);
    *(undefined8 *)(wminfo.plyr[lVar7].frags + 4) = *(undefined8 *)(&DAT_01ae7174 + lVar8);
    *(undefined8 *)(wminfo.plyr[lVar7].frags + 6) = *(undefined8 *)(&DAT_01ae717c + lVar8);
    wminfo.plyr[nextinfo._4_4_].fragcount = *(int *)(&DAT_01ae7184 + (long)nextinfo._4_4_ * 0x2a0);
  }
  cluster = FindClusterInfo(level.cluster);
  pcVar6 = FindClusterInfo(wminfo.next_ep + 1);
  if (((cluster == pcVar6) && (iVar2 = FIntCVar::operator_cast_to_int(&deathmatch), iVar2 == 0)) &&
     ((cluster->flags & 1U) != 0)) {
    local_34 = FINISH_SameHub;
  }
  else if ((pcVar6->flags & 1U) == 0) {
    local_34 = FINISH_NoHub;
  }
  else {
    local_34 = FINISH_NextHub;
  }
  G_LeavingHub(local_34,cluster,&wminfo);
  for (nextinfo._4_4_ = 0; nextinfo._4_4_ < 8; nextinfo._4_4_ = nextinfo._4_4_ + 1) {
    if ((playeringame[nextinfo._4_4_] & 1U) != 0) {
      G_PlayerFinishLevel(nextinfo._4_4_,local_34,changeflags);
    }
  }
  if (local_34 == FINISH_SameHub) {
    if ((level.flags2 & 0x80000000) == 0) {
      G_SnapshotLevel();
      FBehavior::StaticLockLevelVarStrings();
    }
    else {
      FCompressedBuffer::Clean(&(level.info)->Snapshot);
    }
  }
  else {
    G_ClearSnapshots();
    if (local_34 == FINISH_NextHub) {
      P_ClearACSVars(false);
    }
    level.time = 0;
    level.maptime = 0;
  }
  iVar2 = FIntCVar::operator_cast_to_int(&deathmatch);
  if ((iVar2 == 0) &&
     (((level.flags & 1) != 0 || ((pcVar6 == cluster && ((cluster->flags & 1U) != 0)))))) {
    G_WorldDone();
  }
  else {
    gamestate = GS_INTERMISSION;
    viewactive = false;
    automapactive = false;
    WI_Start(&wminfo);
  }
  return;
}

Assistant:

void G_DoCompleted (void)
{
	int i; 

	gameaction = ga_nothing;

	if (   gamestate == GS_DEMOSCREEN
		|| gamestate == GS_FULLCONSOLE
		|| gamestate == GS_STARTUP)
	{
		return;
	}

	if (gamestate == GS_TITLELEVEL)
	{
		level.MapName = nextlevel;
		G_DoLoadLevel (startpos, false);
		startpos = 0;
		viewactive = true;
		return;
	}

	// [RH] Mark this level as having been visited
	if (!(level.flags & LEVEL_CHANGEMAPCHEAT))
		FindLevelInfo (level.MapName)->flags |= LEVEL_VISITED;

	if (automapactive)
		AM_Stop ();

	wminfo.finished_ep = level.cluster - 1;
	wminfo.LName0 = TexMan[TexMan.CheckForTexture(level.info->PName, FTexture::TEX_MiscPatch)];
	wminfo.current = level.MapName;

	if (deathmatch &&
		(dmflags & DF_SAME_LEVEL) &&
		!(level.flags & LEVEL_CHANGEMAPCHEAT))
	{
		wminfo.next = level.MapName;
		wminfo.LName1 = wminfo.LName0;
	}
	else
	{
		level_info_t *nextinfo = FindLevelInfo (nextlevel, false);
		if (nextinfo == NULL || strncmp (nextlevel, "enDSeQ", 6) == 0)
		{
			wminfo.next = nextlevel;
			wminfo.LName1 = NULL;
		}
		else
		{
			wminfo.next = nextinfo->MapName;
			wminfo.LName1 = TexMan[TexMan.CheckForTexture(nextinfo->PName, FTexture::TEX_MiscPatch)];
		}
	}

	CheckWarpTransMap (wminfo.next, true);
	nextlevel = wminfo.next;

	wminfo.next_ep = FindLevelInfo (wminfo.next)->cluster - 1;
	wminfo.maxkills = level.total_monsters;
	wminfo.maxitems = level.total_items;
	wminfo.maxsecret = level.total_secrets;
	wminfo.maxfrags = 0;
	wminfo.partime = TICRATE * level.partime;
	wminfo.sucktime = level.sucktime;
	wminfo.pnum = consoleplayer;
	wminfo.totaltime = level.totaltime;

	for (i=0 ; i<MAXPLAYERS ; i++)
	{
		wminfo.plyr[i].in = playeringame[i];
		wminfo.plyr[i].skills = players[i].killcount;
		wminfo.plyr[i].sitems = players[i].itemcount;
		wminfo.plyr[i].ssecret = players[i].secretcount;
		wminfo.plyr[i].stime = level.time;
		memcpy (wminfo.plyr[i].frags, players[i].frags
				, sizeof(wminfo.plyr[i].frags));
		wminfo.plyr[i].fragcount = players[i].fragcount;
	}

	// [RH] If we're in a hub and staying within that hub, take a snapshot
	//		of the level. If we're traveling to a new hub, take stuff from
	//		the player and clear the world vars. If this is just an
	//		ordinary cluster (not a hub), take stuff from the player, but
	//		leave the world vars alone.
	cluster_info_t *thiscluster = FindClusterInfo (level.cluster);
	cluster_info_t *nextcluster = FindClusterInfo (wminfo.next_ep+1);	// next_ep is cluster-1
	EFinishLevelType mode;

	if (thiscluster != nextcluster || deathmatch ||
		!(thiscluster->flags & CLUSTER_HUB))
	{
		if (nextcluster->flags & CLUSTER_HUB)
		{
			mode = FINISH_NextHub;
		}
		else
		{
			mode = FINISH_NoHub;
		}
	}
	else
	{
		mode = FINISH_SameHub;
	}

	// Intermission stats for entire hubs
	G_LeavingHub(mode, thiscluster, &wminfo);

	for (i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i])
		{ // take away appropriate inventory
			G_PlayerFinishLevel (i, mode, changeflags);
		}
	}

	if (mode == FINISH_SameHub)
	{ // Remember the level's state for re-entry.
		if (!(level.flags2 & LEVEL2_FORGETSTATE))
		{
			G_SnapshotLevel ();
			// Do not free any global strings this level might reference
			// while it's not loaded.
			FBehavior::StaticLockLevelVarStrings();
		}
		else
		{ // Make sure we don't have a snapshot lying around from before.
			level.info->Snapshot.Clean();
		}
	}
	else
	{ // Forget the states of all existing levels.
		G_ClearSnapshots ();

		if (mode == FINISH_NextHub)
		{ // Reset world variables for the new hub.
			P_ClearACSVars(false);
		}
		level.time = 0;
		level.maptime = 0;
	}

	if (!deathmatch &&
		((level.flags & LEVEL_NOINTERMISSION) ||
		((nextcluster == thiscluster) && (thiscluster->flags & CLUSTER_HUB))))
	{
		G_WorldDone ();
		return;
	}

	gamestate = GS_INTERMISSION;
	viewactive = false;
	automapactive = false;

// [RH] If you ever get a statistics driver operational, adapt this.
//	if (statcopy)
//		memcpy (statcopy, &wminfo, sizeof(wminfo));

	WI_Start (&wminfo);
}